

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Instruction *
stackjit::Loader::Instruction::makeWithStringConstant
          (Instruction *__return_storage_ptr__,OpCodes opCode,string *value)

{
  string *value_local;
  OpCodes opCode_local;
  Instruction *instruction;
  
  Instruction(__return_storage_ptr__,StringConstantData,opCode);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mStringValue,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

Loader::Instruction Loader::Instruction::makeWithStringConstant(OpCodes opCode, std::string value) {
		Loader::Instruction instruction(InstructionFormats::StringConstantData, opCode);
		instruction.mStringValue = value;
		return instruction;
	}